

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_connect(Curl_easy *data,_Bool *done)

{
  connectdata *conn_00;
  CURLcode CVar1;
  pingpong *pp;
  ftp_conn *ftpc;
  connectdata *conn;
  CURLcode result;
  _Bool *done_local;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  *done = false;
  Curl_conncontrol(conn_00,0);
  (conn_00->proto).ftpc.pp.response_time = 120000;
  (conn_00->proto).ftpc.pp.statemachine = ftp_statemachine;
  (conn_00->proto).ftpc.pp.endofresp = ftp_endofresp;
  if ((conn_00->handler->flags & 1) != 0) {
    CVar1 = Curl_conn_connect(data,0,true,done);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    conn_00->bits = (ConnectBits)((uint)conn_00->bits & 0xffefffff | 0x100000);
  }
  Curl_pp_init(&(conn_00->proto).ftpc.pp);
  _ftp_state(data,'\x01');
  CVar1 = ftp_multi_statemach(data,done);
  return CVar1;
}

Assistant:

static CURLcode ftp_connect(struct Curl_easy *data,
                            bool *done) /* see description above */
{
  CURLcode result;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;

  *done = FALSE; /* default to not done yet */

  /* We always support persistent connections on ftp */
  connkeep(conn, "FTP default");

  PINGPONG_SETUP(pp, ftp_statemachine, ftp_endofresp);

  if(conn->handler->flags & PROTOPT_SSL) {
    /* BLOCKING */
    result = Curl_conn_connect(data, FIRSTSOCKET, TRUE, done);
    if(result)
      return result;
    conn->bits.ftp_use_control_ssl = TRUE;
  }

  Curl_pp_init(pp); /* once per transfer */

  /* When we connect, we start in the state where we await the 220
     response */
  ftp_state(data, FTP_WAIT220);

  result = ftp_multi_statemach(data, done);

  return result;
}